

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_image_section_cache.c
# Opt level: O2

int pt_iscache_read(pt_image_section_cache *iscache,uint8_t *buffer,uint64_t size,int isid,
                   uint64_t vaddr)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint64_t uVar4;
  pt_section *section;
  uint64_t laddr;
  
  if (size == 0 || (buffer == (uint8_t *)0x0 || iscache == (pt_image_section_cache *)0x0)) {
    iVar1 = -2;
  }
  else {
    iVar1 = pt_iscache_lookup(iscache,&section,&laddr,isid);
    if (-1 < iVar1) {
      if (vaddr < laddr) {
        pt_section_put(section);
        iVar1 = -0xd;
      }
      else {
        iVar1 = pt_section_map(section);
        if (iVar1 < 0) {
          pt_section_put(section);
        }
        else {
          uVar4 = 0xffff;
          if (size < 0xffff) {
            uVar4 = size;
          }
          iVar2 = pt_section_read(section,buffer,(uint16_t)uVar4,vaddr - laddr);
          iVar1 = pt_section_unmap(section);
          iVar3 = pt_section_put(section);
          if ((-1 < iVar1) && (iVar1 = iVar2, iVar3 < 0)) {
            iVar1 = iVar3;
          }
        }
      }
    }
  }
  return iVar1;
}

Assistant:

int pt_iscache_read(struct pt_image_section_cache *iscache, uint8_t *buffer,
		    uint64_t size, int isid, uint64_t vaddr)
{
	struct pt_section *section;
	uint64_t laddr;
	int errcode, status;

	if (!iscache || !buffer || !size)
		return -pte_invalid;

	errcode = pt_iscache_lookup(iscache, &section, &laddr, isid);
	if (errcode < 0)
		return errcode;

	if (vaddr < laddr) {
		(void) pt_section_put(section);
		return -pte_nomap;
	}

	vaddr -= laddr;

	errcode = pt_section_map(section);
	if (errcode < 0) {
		(void) pt_section_put(section);
		return errcode;
	}

	/* We truncate the read if it gets too big.  The user is expected to
	 * issue further reads for the remaining part.
	 */
	if (UINT16_MAX < size)
		size = UINT16_MAX;

	status = pt_section_read(section, buffer, (uint16_t) size, vaddr);

	errcode = pt_section_unmap(section);
	if (errcode < 0) {
		(void) pt_section_put(section);
		return errcode;
	}

	errcode = pt_section_put(section);
	if (errcode < 0)
		return errcode;

	return status;
}